

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_dr_mp3_L3_imdct12(float *x,float *dst,float *overlap)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float si [3];
  float co [3];
  
  fVar5 = x[0xc] + x[9];
  fVar4 = (x[6] + x[3]) * 0.8660254;
  fVar6 = -fVar5 * 0.5 - *x;
  co[0] = fVar4 + fVar6;
  co[1] = fVar5 - *x;
  co[2] = fVar6 - fVar4;
  fVar4 = x[6] - x[3];
  fVar5 = (x[0xc] - x[9]) * 0.8660254;
  fVar6 = x[0xf] - fVar4 * 0.5;
  si[0] = fVar5 + fVar6;
  si[2] = fVar6 - fVar5;
  si[1] = -(fVar4 + x[0xf]);
  lVar1 = 5;
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
    fVar4 = *(float *)((long)overlap + lVar2);
    fVar5 = *(float *)((long)ma_dr_mp3_L3_imdct12::g_twid3 + lVar2 + 0xc);
    fVar3 = *(float *)((long)co + lVar2) * fVar5 +
            *(float *)((long)si + lVar2) * *(float *)((long)ma_dr_mp3_L3_imdct12::g_twid3 + lVar2);
    *(float *)((long)overlap + lVar2) =
         *(float *)((long)co + lVar2) * *(float *)((long)ma_dr_mp3_L3_imdct12::g_twid3 + lVar2) -
         fVar5 * *(float *)((long)si + lVar2);
    fVar5 = ma_dr_mp3_L3_imdct36::g_twid9[lVar1 + 0x11];
    fVar6 = ma_dr_mp3_L3_imdct12::g_twid3[lVar1];
    *(float *)((long)dst + lVar2) = fVar4 * fVar5 - fVar6 * fVar3;
    dst[lVar1] = fVar4 * fVar6 + fVar3 * fVar5;
    lVar1 = lVar1 + -1;
  }
  return;
}

Assistant:

static void ma_dr_mp3_L3_imdct12(float *x, float *dst, float *overlap)
{
    static const float g_twid3[6] = { 0.79335334f,0.92387953f,0.99144486f, 0.60876143f,0.38268343f,0.13052619f };
    float co[3], si[3];
    int i;
    ma_dr_mp3_L3_idct3(-x[0], x[6] + x[3], x[12] + x[9], co);
    ma_dr_mp3_L3_idct3(x[15], x[12] - x[9], x[6] - x[3], si);
    si[1] = -si[1];
    for (i = 0; i < 3; i++)
    {
        float ovl  = overlap[i];
        float sum  = co[i]*g_twid3[3 + i] + si[i]*g_twid3[0 + i];
        overlap[i] = co[i]*g_twid3[0 + i] - si[i]*g_twid3[3 + i];
        dst[i]     = ovl*g_twid3[2 - i] - sum*g_twid3[5 - i];
        dst[5 - i] = ovl*g_twid3[5 - i] + sum*g_twid3[2 - i];
    }
}